

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_ext_pake_parse_serverhello
               (SSL_HANDSHAKE *hs,Array<unsigned_char> *out_secret,uint8_t *out_alert,CBS *contents)

{
  Span<const_unsigned_char> peer_share;
  Span<const_unsigned_char> peer_confirm;
  bool bVar1;
  int iVar2;
  int line;
  Span<unsigned_char> out_secret_00;
  Span<unsigned_char> out_confirm;
  uint16_t named_pake;
  Array<unsigned_char> secret;
  CBS pake_msg;
  uint8_t prover_secret [32];
  uint8_t prover_confirm [32];
  uint16_t local_aa;
  Array<unsigned_char> local_a8;
  uchar *local_98;
  undefined8 uStack_90;
  uchar *local_88;
  undefined8 uStack_80;
  CBS local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uchar local_48 [32];
  
  *out_alert = '2';
  if ((hs->pake_prover)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0) {
    iVar2 = 0x44;
    line = 0xc52;
LAB_00138967:
    ERR_put_error(0x10,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,line);
    *out_alert = 'P';
    return false;
  }
  iVar2 = CBS_get_u16(contents,&local_aa);
  if ((((iVar2 == 0) || (iVar2 = CBS_get_u16_length_prefixed(contents,&local_78), iVar2 == 0)) ||
      (contents->len != 0)) || (local_aa != 0x7d96)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xc5d);
    return false;
  }
  if (local_78.len == 0x61) {
    bVar1 = ssl_credential_st::HasPAKEAttempts
                      ((hs->credential)._M_t.
                       super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl);
    if (!bVar1) {
      iVar2 = 0x145;
      line = 0xc6d;
      goto LAB_00138967;
    }
    local_88 = local_78.data;
    uStack_80 = 0x41;
    local_98 = local_78.data + 0x41;
    uStack_90 = 0x20;
    peer_share.size_ = 0x41;
    peer_share.data_ = local_78.data;
    peer_confirm.size_ = 0x20;
    peer_confirm.data_ = local_98;
    out_secret_00.size_ = 0x20;
    out_secret_00.data_ = (uchar *)&local_68;
    out_confirm.size_ = 0x20;
    out_confirm.data_ = local_48;
    bVar1 = spake2plus::Prover::ComputeConfirmation
                      ((hs->pake_prover)._M_t.
                       super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl,
                       out_confirm,out_secret_00,peer_share,peer_confirm);
    if (bVar1) {
      local_a8.data_ = (uchar *)0x0;
      local_a8.size_ = 0;
      bVar1 = Array<unsigned_char>::InitUninitialized(&local_a8,0x20);
      if (bVar1) {
        *(undefined8 *)(local_a8.data_ + 0x10) = local_58;
        *(undefined8 *)(local_a8.data_ + 0x18) = uStack_50;
        *(undefined8 *)local_a8.data_ = local_68;
        *(undefined8 *)(local_a8.data_ + 8) = uStack_60;
        OPENSSL_free(out_secret->data_);
        out_secret->data_ = local_a8.data_;
        out_secret->size_ = local_a8.size_;
        local_a8.data_ = (uchar *)0x0;
        local_a8.size_ = 0;
      }
      else {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc81);
        *out_alert = 'P';
      }
      Array<unsigned_char>::~Array(&local_a8);
      return bVar1;
    }
    ssl_credential_st::ClaimPAKEAttempt
              ((hs->credential)._M_t.
               super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl);
    iVar2 = 0xc7a;
  }
  else {
    iVar2 = 0xc64;
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,iVar2);
  *out_alert = '/';
  return false;
}

Assistant:

bool ssl_ext_pake_parse_serverhello(SSL_HANDSHAKE *hs,
                                    Array<uint8_t> *out_secret,
                                    uint8_t *out_alert, CBS *contents) {
  *out_alert = SSL_AD_DECODE_ERROR;

  if (!hs->pake_prover) {
    // If we did not offer a PAKE, the extension should have been rejected as
    // unsolicited.
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  CBS pake_msg;
  uint16_t named_pake;
  if (!CBS_get_u16(contents, &named_pake) ||
      !CBS_get_u16_length_prefixed(contents, &pake_msg) ||
      CBS_len(contents) != 0 ||  //
      named_pake != SSL_PAKE_SPAKE2PLUSV1) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  // Check that the server's PAKE share consists of the right number of
  // bytes for a PAKE share and a key confirmation message.
  if (CBS_len(&pake_msg) != spake2plus::kShareSize + spake2plus::kConfirmSize) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }
  Span<const uint8_t> pake_msg_span = pake_msg;

  // Releasing the result of |ComputeConfirmation| lets the client confirm one
  // PAKE guess. If all failures are used up, no more guesses are allowed.
  if (!hs->credential->HasPAKEAttempts()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PAKE_EXHAUSTED);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  uint8_t prover_confirm[spake2plus::kConfirmSize];
  uint8_t prover_secret[spake2plus::kSecretSize];
  if (!hs->pake_prover->ComputeConfirmation(
          prover_confirm, prover_secret,
          pake_msg_span.subspan(0, spake2plus::kShareSize),
          pake_msg_span.subspan(spake2plus::kShareSize))) {
    // Record a failure before releasing the answer to the client.
    hs->credential->ClaimPAKEAttempt();
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  Array<uint8_t> secret;
  if (!secret.CopyFrom(prover_secret)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  *out_secret = std::move(secret);
  return true;
}